

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.hpp
# Opt level: O3

bool burst::detail::
     collect_impl<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>,burst::low_byte_fn,long(*)[256],long*,0ul,1ul,2ul,3ul>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,long *param_3,
               long *param_4)

{
  long lVar1;
  anon_class_40_5_aef1ef96 __f;
  long lVar2;
  long lVar3;
  long lVar4;
  bool is_sorted;
  uint previous;
  bool local_70;
  undefined1 local_6f;
  undefined1 local_6e [2];
  undefined4 local_6c;
  long **local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined4 *puStack_50;
  bool *local_48;
  long *local_40;
  anon_class_40_5_aef1ef96 local_38;
  
  local_68 = &local_40;
  puStack_50 = &local_6c;
  local_6c = 0;
  local_48 = &local_70;
  local_70 = true;
  puStack_60 = local_6e;
  local_58 = &local_6f;
  __f.map = (compose_fn<burst::shift_to_unsigned_fn,_burst::to_ordered_integral_fn> *)puStack_60;
  __f.counters = (long (**) [256])local_68;
  __f.radix = (low_byte_fn *)local_58;
  __f.previous = puStack_50;
  __f.is_sorted = local_48;
  local_40 = param_3;
  std::
  for_each<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,burst::detail::collect_impl<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>,burst::low_byte_fn,long(*)[256],long*,0ul,1ul,2ul,3ul>(__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>,burst::low_byte_fn,long(*)[256],long*,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>)::_lambda(auto:1_const&)_1_>
            (&local_38,first,last,__f);
  lVar2 = *local_40;
  lVar3 = 8;
  lVar4 = lVar2;
  do {
    lVar1 = *(long *)((long)local_40 + lVar3);
    if (lVar2 <= lVar1) {
      lVar2 = lVar1;
    }
    lVar4 = lVar4 + lVar1;
    *(long *)((long)local_40 + lVar3) = lVar4;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x800);
  *param_4 = lVar2;
  lVar2 = local_40[0x100];
  lVar3 = 0;
  lVar4 = lVar2;
  do {
    lVar1 = *(long *)((long)local_40 + lVar3 + 0x808);
    if (lVar2 <= lVar1) {
      lVar2 = lVar1;
    }
    lVar4 = lVar4 + lVar1;
    *(long *)((long)local_40 + lVar3 + 0x808) = lVar4;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x7f8);
  param_4[1] = lVar2;
  lVar2 = local_40[0x200];
  lVar3 = 0;
  lVar4 = lVar2;
  do {
    lVar1 = *(long *)((long)local_40 + lVar3 + 0x1008);
    if (lVar2 <= lVar1) {
      lVar2 = lVar1;
    }
    lVar4 = lVar4 + lVar1;
    *(long *)((long)local_40 + lVar3 + 0x1008) = lVar4;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x7f8);
  param_4[2] = lVar2;
  lVar2 = local_40[0x300];
  lVar3 = 0;
  lVar4 = lVar2;
  do {
    lVar1 = *(long *)((long)local_40 + lVar3 + 0x1808);
    if (lVar2 <= lVar1) {
      lVar2 = lVar1;
    }
    lVar4 = lVar4 + lVar1;
    *(long *)((long)local_40 + lVar3 + 0x1808) = lVar4;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x7f8);
  param_4[3] = lVar2;
  return local_70;
}

Assistant:

bool collect_impl (ForwardIterator first, ForwardIterator last, Map map, Radix radix, RandomAccessIterator1 counters, RandomAccessIterator2 maximums, std::index_sequence<Radices...>)
        {
            using value_type = iterator_value_t<ForwardIterator>;
            constexpr auto radix_value_range = radix_sort_traits<value_type, Map, Radix>::radix_value_range;

            auto previous = std::numeric_limits<invoke_result_t<Map, value_type>>::min();
            auto is_sorted = true;
            std::for_each(first, last,
                [& counters, & map, & radix, & previous, & is_sorted] (const auto & preimage)
                {
                    auto image = map(preimage);
                    is_sorted &= (image >= previous);
                    previous = image;

                    BURST_EXPAND_VARIADIC(++counters[Radices][nth_radix(Radices, radix)(image)]);
                });

            BURST_EXPAND_VARIADIC(maximums[Radices] = partial_sum_max(counters[Radices], counters[Radices] + radix_value_range, counters[Radices]).second);

            return is_sorted;
        }